

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis_encode.cpp
# Opt level: O0

void swizzle_to_rgba(uint8_t *rgbadst,uint8_t *rgbasrc,uint32_t src_len,ktx_size_t image_size,
                    swizzle_e *swizzle)

{
  ulong in_RCX;
  uint in_EDX;
  undefined1 *in_RSI;
  long in_RDI;
  long in_R8;
  uint32_t c;
  ktx_size_t i;
  uint local_34;
  ulong local_30;
  undefined1 *local_10;
  long local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_30 = 0; local_30 < in_RCX; local_30 = in_EDX + local_30) {
    for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
      switch(*(undefined4 *)(in_R8 + (ulong)local_34 * 4)) {
      case 1:
        *(undefined1 *)(local_8 + (ulong)local_34) = *local_10;
        break;
      case 2:
        *(undefined1 *)(local_8 + (ulong)local_34) = local_10[1];
        break;
      case 3:
        *(undefined1 *)(local_8 + (ulong)local_34) = local_10[2];
        break;
      case 4:
        *(undefined1 *)(local_8 + (ulong)local_34) = local_10[3];
        break;
      case 5:
        *(undefined1 *)(local_8 + (ulong)local_34) = 0;
        break;
      case 6:
        *(undefined1 *)(local_8 + (ulong)local_34) = 0xff;
        break;
      default:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/basis_encode.cpp"
                      ,0x7d,
                      "void swizzle_to_rgba(uint8_t *, uint8_t *, uint32_t, ktx_size_t, swizzle_e *)"
                     );
      }
    }
    local_8 = local_8 + 4;
    local_10 = local_10 + in_EDX;
  }
  return;
}

Assistant:

void
swizzle_to_rgba(uint8_t* rgbadst, uint8_t* rgbasrc, uint32_t src_len,
                ktx_size_t image_size, swizzle_e swizzle[4])
{
    for (ktx_size_t i = 0; i < image_size; i += src_len) {
        for (uint32_t c = 0; c < 4; c++) {
            switch (swizzle[c]) {
              case R:
                rgbadst[c] = rgbasrc[0];
                break;
              case G:
                rgbadst[c] = rgbasrc[1];
                break;
              case B:
                rgbadst[c] = rgbasrc[2];
                break;
              case A:
                rgbadst[c] = rgbasrc[3];
                break;
              case ZERO:
                rgbadst[c] = 0x00;
                break;
              case ONE:
                rgbadst[c] = 0xff;
                break;
              default:
                assert(false);
            }
        }
        rgbadst +=4; rgbasrc += src_len;
    }
}